

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_bio.cc
# Opt level: O2

long anon_unknown.dwarf_2f::AsyncCtrl(BIO *bio,int cmd,long num,void *ptr)

{
  BIO *bp;
  long lVar1;
  
  bp = BIO_next((BIO *)bio);
  if (bp == (BIO *)0x0) {
    lVar1 = 0;
  }
  else {
    BIO_clear_retry_flags(bio);
    lVar1 = BIO_ctrl(bp,cmd,num,ptr);
    BIO_copy_next_retry((BIO *)bio);
  }
  return lVar1;
}

Assistant:

static long AsyncCtrl(BIO *bio, int cmd, long num, void *ptr) {
  BIO *next = BIO_next(bio);
  if (next == nullptr) {
    return 0;
  }
  BIO_clear_retry_flags(bio);
  long ret = BIO_ctrl(next, cmd, num, ptr);
  BIO_copy_next_retry(bio);
  return ret;
}